

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bt_peer_connection.cpp
# Opt level: O2

void __thiscall
libtorrent::aux::bt_peer_connection::on_bitfield(bt_peer_connection *this,int received)

{
  crypto_receive_buffer *this_00;
  _Head_base<0UL,_unsigned_int_*,_false> _Var1;
  bool bVar2;
  int iVar3;
  typed_bitfield<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
  *ptVar4;
  uint bits_00;
  span<const_char> sVar5;
  typed_bitfield<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_> bits
  ;
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_38;
  shared_ptr<libtorrent::aux::torrent> t;
  
  ::std::__weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>::__weak_ptr
            ((__weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> *)&bits,
             &(this->super_peer_connection).super_peer_connection_hot_members.m_torrent.
              super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>);
  ::std::__shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>);
  ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count(&local_38);
  peer_connection::received_bytes(&this->super_peer_connection,0,received);
  if (0 < ((((t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            super_torrent_hot_members).m_torrent_file.
            super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          m_files).m_piece_length) {
    iVar3 = crypto_receive_buffer::packet_size(&this->m_recv_buffer);
    if (iVar3 + -1 !=
        (((((t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
           super_torrent_hot_members).m_torrent_file.
           super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->m_files
         ).m_num_pieces + 7) / 8) {
      boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
                ((error_code *)&bits,invalid_bitfield_size,(type *)0x0);
      (*(this->super_peer_connection).super_bandwidth_socket._vptr_bandwidth_socket[0x14])
                (this,(error_code *)&bits,1,2);
      goto LAB_00186dc9;
    }
  }
  this_00 = &this->m_recv_buffer;
  bVar2 = crypto_receive_buffer::packet_finished(this_00);
  if (bVar2) {
    sVar5 = crypto_receive_buffer::get(this_00);
    bits.super_bitfield.m_buf.super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>
    ._M_t.super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
    super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
    super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl =
         (bitfield)(unique_ptr<unsigned_int[],_long>)0x0;
    if (((((t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          super_torrent_hot_members).m_torrent_file.
          super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->m_files)
        .m_piece_length < 1) {
      iVar3 = crypto_receive_buffer::packet_size(this_00);
      bits_00 = iVar3 * 8 - 8;
    }
    else {
      ptVar4 = peer_connection::get_bitfield(&this->super_peer_connection);
      _Var1._M_head_impl =
           *(uint **)&(ptVar4->super_bitfield).m_buf.
                      super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>._M_t.
                      super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t
                      .super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>;
      if ((_Head_base<0UL,_unsigned_int_*,_false>)_Var1._M_head_impl ==
          (_Head_base<0UL,_unsigned_int_*,_false>)0x0) {
        bits_00 = 0;
      }
      else {
        bits_00 = *_Var1._M_head_impl;
      }
    }
    bitfield::assign(&bits.super_bitfield,sVar5.m_ptr + 1,bits_00);
    peer_connection::incoming_bitfield(&this->super_peer_connection,&bits);
    ::std::unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>::~unique_ptr
              ((unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_> *)&bits);
  }
LAB_00186dc9:
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  return;
}

Assistant:

void bt_peer_connection::on_bitfield(int received)
	{
		INVARIANT_CHECK;

		TORRENT_ASSERT(received >= 0);

		auto t = associated_torrent().lock();
		TORRENT_ASSERT(t);

		received_bytes(0, received);
		// if we don't have the metadata, we cannot
		// verify the bitfield size
		if (t->valid_metadata()
			&& m_recv_buffer.packet_size() - 1 != (t->torrent_file().num_pieces() + CHAR_BIT - 1) / CHAR_BIT)
		{
			disconnect(errors::invalid_bitfield_size, operation_t::bittorrent, peer_error);
			return;
		}

		if (!m_recv_buffer.packet_finished()) return;

		span<char const> recv_buffer = m_recv_buffer.get();

		typed_bitfield<piece_index_t> bits;
		bits.assign(recv_buffer.data() + 1
			, t->valid_metadata()?get_bitfield().size():(m_recv_buffer.packet_size()-1)*CHAR_BIT);

		incoming_bitfield(bits);
	}